

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

bool __thiscall hgdb::json::VarStmt::operator==(VarStmt *this,VarStmt *stmt)

{
  bool bVar1;
  bool bVar2;
  anon_class_16_2_9763bfdf local_38;
  bool local_21;
  
  if ((this->super_Scope<hgdb::json::VarStmt>).filename._M_string_length == 0) {
    bVar1 = true;
    if ((this->super_Scope<hgdb::json::VarStmt>).line_num.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      bVar1 = (this->super_Scope<hgdb::json::VarStmt>).line_num.
              super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0;
    }
  }
  else {
    bVar1 = false;
  }
  if ((stmt->super_Scope<hgdb::json::VarStmt>).filename._M_string_length == 0) {
    bVar2 = true;
    if ((stmt->super_Scope<hgdb::json::VarStmt>).line_num.
        super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int>._M_engaged == true) {
      bVar2 = (stmt->super_Scope<hgdb::json::VarStmt>).line_num.
              super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if ((!(bool)(bVar1 | bVar2)) &&
     (bVar1 = Scope<hgdb::json::VarStmt>::operator==
                        (&this->super_Scope<hgdb::json::VarStmt>,
                         &stmt->super_Scope<hgdb::json::VarStmt>), !bVar1)) {
    return false;
  }
  local_38.__lhs = &this->var_;
  local_38.__ret = &local_21;
  local_21 = true;
  (*std::__detail::__variant::
    __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:1232:3)_&&,_const_std::variant<hgdb::json::Variable,_unsigned_long>_&>
    ::_S_vtable._M_arr
    [(long)(char)*(__index_type *)
                  ((long)&(stmt->var_).super__Variant_base<hgdb::json::Variable,_unsigned_long>.
                          super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
                          super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
                          super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
                          super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
                          super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long> + 0x58)
     + 1]._M_data)(&local_38,&stmt->var_);
  return local_21;
}

Assistant:

[[nodiscard]] bool operator==(const VarStmt &stmt) const {
        auto self_uninitialized = filename.empty() && (!line_num || (*line_num == 0));
        auto stmt_uninitialized =
            stmt.filename.empty() && (!stmt.line_num || (*stmt.line_num == 0));
        if (self_uninitialized || stmt_uninitialized) {
            return var_ == stmt.var_;
        } else {
            return Scope<VarStmt>::operator==(stmt) && var_ == stmt.var_;
        }
    }